

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O1

int jpc_qcx_getcompparms
              (jpc_qcxcp_t *compparms,jpc_cstate_t *cstate,jas_stream_t *in,uint_fast16_t len)

{
  int iVar1;
  uint uVar2;
  ulong in_RAX;
  uint_fast16_t *puVar3;
  long lVar4;
  long lVar5;
  uint_fast8_t tmp;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar1 = jpc_getuint8((jas_stream_t *)cstate,(uint_fast8_t *)((long)&uStack_38 + 7));
  if (iVar1 != 0) {
    return -1;
  }
  uVar2 = uStack_38._7_1_ & 0x1f;
  compparms->qntsty = (uint_fast8_t)uVar2;
  compparms->numguard = uStack_38._7_1_ >> 5;
  if (uVar2 == 2) {
    uVar2 = (uint)((ulong)((long)&in[-1].rwlimit_ + 7) >> 1);
  }
  else if (uVar2 != 1) {
    if ((uStack_38 & 0x1f00000000000000) != 0) goto LAB_0011b7a4;
    uVar2 = (int)in - 1;
  }
  compparms->numstepsizes = uVar2;
LAB_0011b7a4:
  iVar1 = compparms->numstepsizes;
  if ((long)iVar1 < 0x65) {
    if (iVar1 < 1) {
      compparms->stepsizes = (uint_fast16_t *)0x0;
    }
    else {
      puVar3 = (uint_fast16_t *)jas_alloc2((long)iVar1,8);
      compparms->stepsizes = puVar3;
      if (puVar3 == (uint_fast16_t *)0x0) {
        abort();
      }
      if (0 < compparms->numstepsizes) {
        lVar5 = 0;
        lVar4 = 0;
        do {
          if (compparms->qntsty == '\0') {
            iVar1 = jpc_getuint8((jas_stream_t *)cstate,(uint_fast8_t *)((long)&uStack_38 + 7));
            if (iVar1 != 0) goto LAB_0011b83e;
            *(ulong *)((long)compparms->stepsizes + lVar5) = (ulong)((uStack_38._7_1_ & 0xf8) << 8);
          }
          else {
            iVar1 = jpc_getuint16((jas_stream_t *)cstate,
                                  (uint_fast16_t *)((long)compparms->stepsizes + lVar5));
            if (iVar1 != 0) goto LAB_0011b83e;
          }
          lVar4 = lVar4 + 1;
          lVar5 = lVar5 + 8;
        } while (lVar4 < compparms->numstepsizes);
      }
    }
    if ((cstate[1].numcomps & 3) == 0) {
      return 0;
    }
  }
LAB_0011b83e:
  if (compparms->stepsizes != (uint_fast16_t *)0x0) {
    jas_free(compparms->stepsizes);
  }
  return -1;
}

Assistant:

static int jpc_qcx_getcompparms(jpc_qcxcp_t *compparms, jpc_cstate_t *cstate,
  jas_stream_t *in, uint_fast16_t len)
{
	uint_fast8_t tmp;
	int n;
	int i;

	/* Eliminate compiler warning about unused variables. */
	(void)cstate;

	n = 0;
	if (jpc_getuint8(in, &tmp)) {
		return -1;
	}
	++n;
	compparms->qntsty = tmp & 0x1f;
	compparms->numguard = (tmp >> 5) & 7;
	switch (compparms->qntsty) {
	case JPC_QCX_SIQNT:
		compparms->numstepsizes = 1;
		break;
	case JPC_QCX_NOQNT:
		compparms->numstepsizes = (len - n);
		break;
	case JPC_QCX_SEQNT:
		/* XXX - this is a hack */
		compparms->numstepsizes = (len - n) / 2;
		break;
	}
	/* Ensure that the step size array is sufficiently large. */
	if (compparms->numstepsizes > 3 * JPC_MAXRLVLS + 1) {
		jpc_qcx_destroycompparms(compparms);
		return -1;
	}
	if (compparms->numstepsizes > 0) {
		if (!(compparms->stepsizes = jas_alloc2(compparms->numstepsizes,
		  sizeof(uint_fast16_t)))) {
			abort();
		}
		for (i = 0; i < compparms->numstepsizes; ++i) {
			if (compparms->qntsty == JPC_QCX_NOQNT) {
				if (jpc_getuint8(in, &tmp)) {
					jpc_qcx_destroycompparms(compparms);
					return -1;
				}
				compparms->stepsizes[i] = JPC_QCX_EXPN(tmp >> 3);
			} else {
				if (jpc_getuint16(in, &compparms->stepsizes[i])) {
					jpc_qcx_destroycompparms(compparms);
					return -1;
				}
			}
		}
	} else {
		compparms->stepsizes = 0;
	}
	if (jas_stream_error(in) || jas_stream_eof(in)) {
		jpc_qcx_destroycompparms(compparms);
		return -1;
	}
	return 0;
}